

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::ModelExtractor::extractModel<Person>(ModelExtractor *this,shared_connection *_con)

{
  int *piVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  Person *obj;
  bean_key local_38;
  
  obj = (Person *)operator_new(0x40);
  (obj->name)._M_dataplus._M_p = (pointer)0x0;
  (obj->name)._M_string_length = 0;
  (obj->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(obj->name).field_2 + 8) = 0;
  (obj->bio).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (obj->bio).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  obj->age = 0.0;
  (obj->bio).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (obj->name)._M_dataplus._M_p = (pointer)&(obj->name).field_2;
  (obj->name)._M_string_length = 0;
  (obj->name).field_2._M_local_buf[0] = '\0';
  (obj->bio).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (obj->bio).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (obj->bio).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar2 = _con->res;
  if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &psVar2->refCount;
    *piVar1 = *piVar1 + 1;
    if (*piVar1 == 0) {
      (*psVar2->_vptr_shared_cnt_obj_pair[1])(psVar2);
    }
  }
  local_38.id = -1;
  local_38.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    psVar2->refCount = psVar2->refCount + 1;
  }
  local_38.con.res = psVar2;
  AVisitor<hiberlite::ExtractModel>::startWalk<Person>
            (&this->super_AVisitor<hiberlite::ExtractModel>,obj,&local_38);
  local_38.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_38.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_38.con.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_38.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  access::destroy<hiberlite::ModelExtractor,Person>(this,obj);
  if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &psVar2->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*psVar2->_vptr_shared_cnt_obj_pair[1])(psVar2);
    }
  }
  return;
}

Assistant:

void ModelExtractor::extractModel(shared_connection _con)
{
	C* bean;
	construct(*this, &bean, static_cast<unsigned int>(0));
	bean_key key(_con, Database::NULL_ID);
	startWalk(*bean, key);
	destroy(*this, bean, static_cast<unsigned int>(0));
}